

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O3

void CountTracks(Node *node,uint *cnt)

{
  uint uVar1;
  bool bVar2;
  pointer ppNVar3;
  ulong uVar4;
  ulong uVar5;
  
  if ((((1 < (ulong)(((long)(node->aPositionKeys).
                            super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(node->aPositionKeys).
                            super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) ||
       (1 < (ulong)(((long)(node->aRotationKeys).
                           super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(node->aRotationKeys).
                           super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))) ||
      (1 < (ulong)(((long)(node->aScalingKeys).
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(node->aScalingKeys).
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))) ||
     ((0x10 < (ulong)((long)(node->aCameraRollKeys).
                            super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(node->aCameraRollKeys).
                           super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                           ._M_impl.super__Vector_impl_data._M_start) ||
      (1 < (ulong)(((long)(node->aTargetPositionKeys).
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(node->aTargetPositionKeys).
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))))) {
    uVar1 = *cnt;
    *cnt = uVar1 + 1;
    if (1 < (ulong)(((long)(node->aTargetPositionKeys).
                           super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(node->aTargetPositionKeys).
                           super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
      *cnt = uVar1 + 2;
    }
  }
  ppNVar3 = (node->mChildren).
            super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((node->mChildren).
      super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppNVar3) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      CountTracks(ppNVar3[uVar4],cnt);
      ppNVar3 = (node->mChildren).
                super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar2 = uVar5 < (ulong)((long)(node->mChildren).
                                    super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar3 >> 3)
      ;
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

void CountTracks(D3DS::Node* node, unsigned int& cnt)
{
    //////////////////////////////////////////////////////////////////////////////
    // We will never generate more than one channel for a node, so
    // this is rather easy here.

    if (node->aPositionKeys.size()  > 1  || node->aRotationKeys.size()   > 1   ||
        node->aScalingKeys.size()   > 1  || node->aCameraRollKeys.size() > 1 ||
        node->aTargetPositionKeys.size()  > 1)
    {
        ++cnt;

        // account for the additional channel for the camera/spotlight target position
        if (node->aTargetPositionKeys.size()  > 1)++cnt;
    }

    // Recursively process all children
    for (unsigned int i = 0; i < node->mChildren.size();++i)
        CountTracks(node->mChildren[i],cnt);
}